

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O3

void g_readwrite_setup(void)

{
  _class *p_Var1;
  undefined8 in_RAX;
  t_symbol *ptVar2;
  uint uVar3;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  ptVar2 = gensym("savestate");
  savestate_class = class_new(ptVar2,savestate_new,(t_method)0x0,0x48,0,A_NULL);
  class_addlist(savestate_class,savestate_list);
  p_Var1 = canvas_class;
  ptVar2 = gensym("write");
  class_addmethod(p_Var1,glist_write,ptVar2,A_SYMBOL,7,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("read");
  class_addmethod(p_Var1,glist_read,ptVar2,A_SYMBOL,7,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("mergefile");
  class_addmethod(p_Var1,glist_mergefile,ptVar2,A_SYMBOL,7,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("savetofile");
  class_addmethod(p_Var1,canvas_savetofile,ptVar2,A_SYMBOL,2,6,(ulong)uVar3 << 0x20);
  p_Var1 = canvas_class;
  ptVar2 = gensym("saveto");
  class_addmethod(p_Var1,canvas_saveto,ptVar2,A_CANT,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("saved");
  class_addmethod(p_Var1,canvas_saved,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("menusave");
  class_addmethod(p_Var1,canvas_menusave,ptVar2,A_DEFFLOAT,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("menusaveas");
  class_addmethod(p_Var1,canvas_menusaveas,ptVar2,A_DEFFLOAT,0);
  return;
}

Assistant:

void g_readwrite_setup(void)
{
    savestate_setup();
    class_addmethod(canvas_class, (t_method)glist_write,
        gensym("write"), A_SYMBOL, A_DEFSYM, A_NULL);
    class_addmethod(canvas_class, (t_method)glist_read,
        gensym("read"), A_SYMBOL, A_DEFSYM, A_NULL);
    class_addmethod(canvas_class, (t_method)glist_mergefile,
        gensym("mergefile"), A_SYMBOL, A_DEFSYM, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_savetofile,
        gensym("savetofile"), A_SYMBOL, A_SYMBOL, A_DEFFLOAT, 0);
    class_addmethod(canvas_class, (t_method)canvas_saveto,
        gensym("saveto"), A_CANT, 0);
    class_addmethod(canvas_class, (t_method)canvas_saved,
        gensym("saved"), A_GIMME, 0);
/* ------------------ from the menu ------------------------- */
    class_addmethod(canvas_class, (t_method)canvas_menusave,
        gensym("menusave"), A_DEFFLOAT, 0);
    class_addmethod(canvas_class, (t_method)canvas_menusaveas,
        gensym("menusaveas"), A_DEFFLOAT, 0);
}